

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O0

nh_bool find_align(nh_roles_info *ri,char *align_str,int *out_align)

{
  int iVar1;
  int local_2c;
  int i;
  int *out_align_local;
  char *align_str_local;
  nh_roles_info *ri_local;
  
  local_2c = 0;
  while( true ) {
    if (ri->num_aligns <= local_2c) {
      return '\0';
    }
    iVar1 = strcmp(align_str,ri->alignnames[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *out_align = local_2c;
  return '\x01';
}

Assistant:

static nh_bool find_align(const struct nh_roles_info *ri,
			  const char *align_str, int *out_align)
{
    int i;

    for (i = 0; i < ri->num_aligns; i++) {
	if (!strcmp(align_str, ri->alignnames[i])) {
	    *out_align = i;
	    return TRUE;
	}
    }
    return FALSE;
}